

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

CreatorType
GEO::Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_>::find_creator(string *name)

{
  bool bVar1;
  pointer ppVar2;
  _func_Delaunay_ptr_uchar_ptr *local_30;
  _Self local_28;
  _Self local_20;
  iterator i;
  Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *self;
  string *name_local;
  
  i._M_node = (_Base_ptr)instance();
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&)>_>_>
       ::find(&((Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *)i._M_node)->
               registry_,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&)>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&)>_>_>
              *)&(i._M_node)->_M_left);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_30 = (_func_Delaunay_ptr_uchar_ptr *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::Delaunay_*(*)(const_unsigned_char_&)>_>
             ::operator->(&local_20);
    local_30 = ppVar2->second;
  }
  return local_30;
}

Assistant:

static CreatorType find_creator(const std::string& name) {
            Factory& self = instance();
            auto i = self.registry_.find(name);
            return i == self.registry_.end() ? nullptr : i->second;
        }